

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall
particleSamples::read_in_particle_samples_SMASH_mixed_event_gzipped(particleSamples *this)

{
  int iVar1;
  _Ios_Openmode _Var2;
  void *pvVar3;
  istream *piVar4;
  value_type *__x;
  long in_RDI;
  particle_info temp_particle_info;
  stringstream temp2;
  int ipart;
  stringstream temp1;
  int num_particles;
  int ievent;
  int charge;
  int pdg_id;
  int pdg_mother2;
  int pdg_mother1;
  int parent_proc_type;
  int n_particle;
  string temp_string;
  istream *in_stack_fffffffffffffb38;
  istream *in_stack_fffffffffffffb40;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_fffffffffffffb58;
  particleSamples *in_stack_fffffffffffffb60;
  double local_428 [2];
  double local_418;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0 [5];
  stringstream local_3b8 [168];
  gzFile in_stack_fffffffffffffcf0;
  particleSamples *in_stack_fffffffffffffcf8;
  string local_230 [36];
  int local_20c;
  stringstream local_208 [392];
  void *local_80;
  string local_68 [32];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  string local_28 [40];
  
  clear_out_previous_record(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  std::__cxx11::string::string(local_28);
  local_44 = 0;
  local_48 = 0;
  while (local_48 < *(int *)(in_RDI + 0x5f0)) {
    gz_readline_abi_cxx11_(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::__cxx11::string::operator=(local_28,local_68);
    std::__cxx11::string::~string(local_68);
    iVar1 = gzeof(*(undefined8 *)(in_RDI + 0x5e8));
    if (iVar1 != 0) break;
    pvVar3 = operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x14dd77);
    local_80 = pvVar3;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 *)in_stack_fffffffffffffb40,(value_type *)in_stack_fffffffffffffb38);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_208,local_28,_Var2);
    std::istream::operator>>((istream *)local_208,&local_2c);
    for (local_20c = 0; local_20c < local_2c; local_20c = local_20c + 1) {
      gz_readline_abi_cxx11_(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      std::__cxx11::string::operator=(local_28,local_230);
      std::__cxx11::string::~string(local_230);
      _Var2 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_3b8,local_28,_Var2);
      piVar4 = (istream *)std::istream::operator>>((istream *)local_3b8,&local_3c);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_40);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_30);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_34);
      std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>((istream *)local_3b8,local_428);
      piVar4 = (istream *)std::istream::operator>>(piVar4,local_3e0);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_3f8);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_3f0);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_3e8);
      __x = (value_type *)std::istream::operator>>(piVar4,&local_400);
      in_stack_fffffffffffffb40 = (istream *)std::istream::operator>>((istream *)__x,&local_418);
      in_stack_fffffffffffffb38 =
           (istream *)std::istream::operator>>(in_stack_fffffffffffffb40,&local_410);
      std::istream::operator>>(in_stack_fffffffffffffb38,&local_408);
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     **)(in_RDI + 0x698),(long)local_44);
      std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                ((vector<particle_info,_std::allocator<particle_info>_> *)piVar4,__x);
      std::__cxx11::stringstream::~stringstream(local_3b8);
    }
    local_48 = local_2c + local_48;
    local_44 = local_44 + 1;
    std::__cxx11::stringstream::~stringstream(local_208);
  }
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_SMASH_mixed_event_gzipped() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);

    std::string temp_string;
    int n_particle;
    int parent_proc_type;
    int pdg_mother1, pdg_mother2;
    int pdg_id, charge;
    int ievent = 0;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        temp_string = gz_readline(inputfile_mixed_event_gz);

        if (gzeof(inputfile_mixed_event_gz)) break;

        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;
        for (int ipart = 0; ipart < n_particle; ipart++) {
            temp_string = gz_readline(inputfile_mixed_event_gz);
            std::stringstream temp2(temp_string);
            temp2 >> pdg_id >> charge >> parent_proc_type >> pdg_mother1
                >> pdg_mother2;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.mass >> temp_particle_info.t
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.E
                >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz;
            temp_particle_info.monval = pdg_id;
            (*full_particle_list_mixed_event)[ievent]->push_back(
                temp_particle_info);
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}